

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX.cpp
# Opt level: O3

void amrex::write_to_stderr_without_buffering(char *str)

{
  ostream *poVar1;
  __string_type tmp;
  ostringstream procall;
  ostringstream local_188 [376];
  
  fflush((FILE *)0x0);
  if (str != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    poVar1 = (ostream *)std::ostream::operator<<(local_188,*(int *)(ParallelContext::frames + 0xc));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"::",2);
    std::__cxx11::stringbuf::str();
    write_to_stderr_without_buffering();
  }
  return;
}

Assistant:

void
amrex::write_to_stderr_without_buffering (const char* str)
{
    //
    // Flush all buffers.
    //
    fflush(NULL);

    if (str)
    {
        std::ostringstream procall;
        procall << ParallelDescriptor::MyProc() << "::";
        auto tmp = procall.str();
        const char *cprocall = tmp.c_str();
        const char * const end = " !!!\n";
        fwrite(cprocall, strlen(cprocall), 1, stderr);
        fwrite(str, strlen(str), 1, stderr);
        fwrite(end, strlen(end), 1, stderr);
    }
}